

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O3

void left_side(int row,int left_mark,int right,char *limits)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int scol;
  int iVar4;
  int iVar5;
  uint row_00;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  char *local_88;
  ulong local_80;
  char *local_70;
  char *local_68;
  char *local_58;
  
  uVar10 = (ulong)(uint)left_mark;
  row_00 = step + row;
  if (row_00 < 0x15) {
    if (limits == (char *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = limits[1] <= *limits;
    }
  }
  else {
    bVar2 = false;
  }
  local_80 = 0;
  if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
    local_68 = cs_rows[row];
    local_88 = cs_left + row;
    local_70 = cs_right + row;
  }
  else {
    local_68 = (char *)0x0;
    local_88 = (char *)0x0;
    local_70 = (char *)0x0;
  }
  if (limits == (char *)0x0) {
    local_58 = (char *)0x0;
  }
  else {
    uVar8 = 0;
    if (0 < start_col - *limits) {
      uVar8 = start_col - *limits;
    }
    local_80 = (ulong)uVar8;
    if (left_mark < (int)uVar8) {
      uVar10 = local_80;
    }
    local_58 = limits + 1;
  }
  iVar9 = (int)uVar10;
  if (iVar9 <= right) {
    do {
      iVar5 = step;
      iVar4 = start_row;
      scol = start_col;
      uVar11 = (uint)local_80;
      uVar8 = (int)left_ptrs[row][right];
      if ((int)left_ptrs[row][right] < (int)uVar11) {
        uVar8 = uVar11;
      }
      pcVar1 = viz_clear_rows[row];
      if (pcVar1[right] == '\0') {
        if ((int)uVar8 < iVar9) {
          uVar8 = iVar9 + -1 + (uint)(viz_clear_rows[(long)row - (long)step][iVar9] == '\0');
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          if ((int)uVar8 <= right) {
            memset(local_68 + (int)uVar8,1,(ulong)(right - uVar8) + 1);
          }
          if ((int)uVar8 < (int)*local_88) {
            *local_88 = (char)uVar8;
          }
          if (*local_70 < right) {
            *local_70 = (char)right;
          }
        }
        else if ((int)uVar8 <= right) {
          uVar11 = uVar8;
          do {
            (*vis_func)(uVar11,row,varg);
            uVar11 = uVar11 + 1;
          } while (right + 1U != uVar11);
        }
        right = uVar8 - 1;
      }
      else {
        uVar12 = right;
        if (right != start_col) {
          if ((int)uVar8 <= right) {
            do {
              if (iVar5 < 0) {
                iVar6 = q2_path(iVar4,scol,row,right);
              }
              else {
                iVar6 = q3_path(iVar4,scol,row,right);
              }
              uVar12 = right;
            } while ((iVar6 == 0) &&
                    (uVar12 = right - 1, bVar3 = (int)uVar8 < right, right = uVar12, bVar3));
          }
          if ((int)uVar12 < (int)uVar11) {
            return;
          }
          if (uVar12 == uVar11) {
            if (vis_func != (_func_void_int_int_void_ptr *)0x0) {
              (*vis_func)(uVar11,row,varg);
              return;
            }
            local_68[local_80] = '\x01';
            if ((int)*local_88 <= (int)uVar11) {
              return;
            }
            *local_88 = (char)local_80;
            return;
          }
          right = uVar8;
          if ((int)uVar12 <= (int)uVar8) goto LAB_00283d11;
        }
        right = uVar12;
        iVar5 = step;
        iVar4 = start_row;
        uVar13 = uVar10;
        if ((int)uVar8 < iVar9) {
          do {
            uVar12 = (uint)uVar13;
            if (iVar5 < 0) {
              iVar6 = q2_path(iVar4,scol,row,uVar12);
            }
            else {
              iVar6 = q3_path(iVar4,scol,row,uVar12);
            }
            uVar7 = uVar12;
            if (iVar6 == 0) break;
            uVar7 = uVar12 - 1;
            uVar13 = (ulong)uVar7;
          } while ((int)uVar8 < (int)uVar12);
          uVar8 = uVar7 + 1;
        }
        if ((int)uVar8 <= right) {
          if ((((uVar8 == right) && (uVar8 = right, 0 < scol)) && (right == scol)) &&
             (uVar8 = scol, pcVar1[scol - 1U] == '\0')) {
            uVar8 = scol - 1U;
          }
          if ((int)uVar8 <= (int)uVar11) {
            uVar8 = uVar11;
          }
          if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
            if ((int)uVar8 <= right) {
              memset(local_68 + uVar8,1,(ulong)(right - uVar8) + 1);
            }
            if ((int)uVar8 < (int)*local_88) {
              *local_88 = (char)uVar8;
            }
            if (*local_70 < right) {
              *local_70 = (char)right;
            }
          }
          else if ((int)uVar8 <= right) {
            uVar11 = uVar8;
            do {
              (*vis_func)(uVar11,row,varg);
              uVar11 = uVar11 + 1;
            } while (right + 1U != uVar11);
          }
          if (bVar2) {
            left_side(row_00,uVar8,right,local_58);
          }
          right = uVar8 - 1;
        }
      }
LAB_00283d11:
    } while (iVar9 <= right);
  }
  return;
}

Assistant:

static void left_side(int row, int left_mark, int right, const char *limits)
{
    int		  left, left_edge, nrow, deeper, result;
    int  i;
    char *rowp;
    char	  *row_min, *row_max;
    int		  lim_min;

    rowp = row_min = row_max = 0;
    nrow    = row+step;
    deeper  = good_row(nrow) && (!limits || (*limits >= *(limits+1)));
    if (!vis_func) {
	rowp    = cs_rows[row];
	row_min = &cs_left[row];
	row_max = &cs_right[row];
    }
    if (limits) {
	lim_min = start_col - *limits;
	if (lim_min < 0) lim_min = 0;
	if (left_mark < lim_min) left_mark = lim_min;
	limits++; /* prepare for next row */
    } else
	lim_min = 0;

    while (right >= left_mark) {
	left_edge = left_ptrs[row][right];
	if (left_edge < lim_min) left_edge = lim_min;

	if (!is_clear(row,right)) {
	    /* Jump to the far side of a stone wall. */
	    if (left_edge < left_mark) {
		/* Maybe see more (kludge). */
		left_edge = is_clear(row-step,left_mark) ?
						    left_mark-1 : left_mark;
	    }
	    if (vis_func) {
		for (i = left_edge; i <= right; i++) (*vis_func)(i, row, varg);
	    } else {
		for (i = left_edge; i <= right; i++) set_cs(rowp,i);
		set_min(left_edge); set_max(right);
	    }
	    right = left_edge - 1; /* no limit check necessary */
	    continue;
	}

	if (right != start_col) {
	    /* Find the right side. */
	    for (; right >= left_edge; right--) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,right);
		} else {
		    result = q3_path(start_row,start_col,row,right);
		}
		if (result) break;
	    }

	    /* Check for boundary conditions. */
	    if (right < lim_min) return;
	    if (right == lim_min) {
		if (vis_func) (*vis_func)(lim_min, row, varg);
		else {
		    set_cs(rowp,lim_min);
		    set_min(lim_min);
		}
		return;
	    }
	    /* Check if we can see any spots in the opening. */
	    if (right <= left_edge) {
		right = left_edge;
		continue;
	    }
	}

	/* Find the left side. */
	if (left_mark > left_edge) {
	    for (left = left_mark; left >= left_edge; --left) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,left);
		} else {
		    result = q3_path(start_row,start_col,row,left);
		}
		if (!result) break;
	    }
	    left++;	/* get rid of the last decrement */
	}
	else
	    left = left_edge;

	if (left <= right) {
	    /* An ugly special case. */
	    if (left == right && right == start_col &&
			    start_col > 0 && !is_clear(row,start_col-1))
		left = start_col-1;

	    if (left < lim_min) left = lim_min;
	    if (vis_func)
		for (i = left; i <= right; i++) (*vis_func)(i, row, varg);
	    else {
		for (i = left; i <= right; i++) set_cs(rowp,i);
		set_min(left);      set_max(right);
	    }

	    /* Recurse */
	    if (deeper) left_side(nrow,left,right,limits);
	    right = left - 1; /* no limit check necessary */
	}
    }
}